

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_tex_parameteriuiv(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  allocator<char> local_3d;
  GLuint params [1];
  string local_38;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    params[0] = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "GL_INVALID_ENUM is generated if target or pname is not an accepted value.",&local_3d
              );
    NegativeTestContext::beginSection(ctx,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    glu::CallLogWrapper::glGetTexParameterIuiv(&ctx->super_CallLogWrapper,0xffffffff,0x2800,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glGetTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0xffffffff,params);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glGetTexParameterIuiv
              (&ctx->super_CallLogWrapper,0xffffffff,0xffffffff,params);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeStateApiTests.cpp"
             ,0x1ef);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void get_tex_parameteriuiv (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a higher context version.");

	GLuint params[1] = { 0 };

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetTexParameterIuiv(-1, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameterIuiv(GL_TEXTURE_2D, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameterIuiv(-1, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}